

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_model_v2.c
# Opt level: O3

MPP_RET bits_model_update(RcModelV2Ctx *ctx,EncRcTaskInfo *cfg)

{
  RK_S32 val;
  RK_S32 RVar1;
  int iVar2;
  RK_S32 RVar3;
  uint uVar4;
  RK_U32 RVar5;
  uint uVar6;
  int iVar7;
  
  RVar3 = cfg->bit_real;
  val = cfg->madi;
  if (((byte)rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2","enter %p\n","bits_model_update",ctx);
  }
  mpp_data_update_v2(ctx->stat_rate,(uint)(RVar3 != 0));
  mpp_data_update_v2(ctx->stat_bits,RVar3);
  RVar1 = mpp_data_sum_v2(ctx->stat_bits);
  ctx->ins_bps = RVar1 / (ctx->usr_cfg).stats_time;
  iVar2 = ctx->stat_watl + RVar3;
  if (ctx->watl_thrd <= iVar2) {
    iVar2 = ctx->watl_thrd;
  }
  iVar2 = iVar2 - ctx->bit_per_frame;
  iVar7 = 0;
  if (0 < iVar2) {
    iVar7 = iVar2;
  }
  ctx->stat_watl = iVar7;
  switch(cfg->frame_type) {
  case INTER_P_FRAME:
    mpp_data_update_v2(ctx->p_bit,RVar3);
    mpp_data_update_v2(ctx->madi,val);
    RVar3 = mpp_data_sum_v2(ctx->p_bit);
    ctx->p_sumbits = RVar3 + (uint)(RVar3 == 0);
    ctx->p_scale = 0x10;
    break;
  case INTRA_FRAME:
    mpp_data_update_v2(ctx->i_bit,RVar3);
    uVar4 = mpp_data_sum_v2(ctx->i_bit);
    ctx->i_sumbits = uVar4;
    uVar6 = (uVar4 * 0x50) / (ctx->p_sumbits * 2);
    ctx->i_scale = uVar6;
    if (((byte)rc_debug & 0x40) != 0) {
      _mpp_log_l(4,"rc_model_v2","i_sumbits %d p_sumbits %d i_scale %d\n","bits_model_update",
                 (ulong)uVar4,(ulong)ctx->p_sumbits,uVar6);
    }
    break;
  case INTER_VI_FRAME:
    mpp_data_update_v2(ctx->vi_bit,RVar3);
    RVar5 = mpp_data_sum_v2(ctx->vi_bit);
    ctx->vi_sumbits = RVar5;
    uVar6 = (RVar5 * 0x50) / (ctx->p_sumbits * 2);
    uVar4 = 0x140;
    if ((int)uVar6 < 0x140) {
      uVar4 = uVar6;
    }
    uVar6 = 0x10;
    if (0x10 < (int)uVar4) {
      uVar6 = uVar4;
    }
    ctx->vi_scale = uVar6;
    break;
  case INTRA_RFH_FRAME:
    mpp_data_update_v2(ctx->i_refresh_bit,RVar3);
    mpp_data_update_v2(ctx->madi,val);
    RVar5 = mpp_data_sum_v2(ctx->i_refresh_bit);
    ctx->i_refresh_sumbits = RVar5;
    uVar6 = (RVar5 * 0x50) / (ctx->p_sumbits * (ctx->usr_cfg).refresh_len);
    uVar4 = 0x40;
    if ((int)uVar6 < 0x40) {
      uVar4 = uVar6;
    }
    uVar6 = 0x10;
    if (0x10 < (int)uVar4) {
      uVar6 = uVar4;
    }
    ctx->i_refresh_scale = uVar6;
  }
  if (((byte)rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2","leave %p\n","bits_model_update",ctx);
  }
  return MPP_OK;
}

Assistant:

MPP_RET bits_model_update(RcModelV2Ctx *ctx, EncRcTaskInfo *cfg)
{
    RcCfg *usr_cfg = &ctx->usr_cfg;
    RK_S32 real_bit = cfg->bit_real;
    RK_U32 madi = cfg->madi;
    RK_S32 water_level = 0;

    rc_dbg_func("enter %p\n", ctx);

    mpp_data_update_v2(ctx->stat_rate, real_bit != 0);
    mpp_data_update_v2(ctx->stat_bits, real_bit);

    ctx->ins_bps = mpp_data_sum_v2(ctx->stat_bits) / usr_cfg->stats_time;
    if (real_bit + ctx->stat_watl > ctx->watl_thrd)
        water_level = ctx->watl_thrd - ctx->bit_per_frame;
    else
        water_level = real_bit + ctx->stat_watl - ctx->bit_per_frame;

    if (water_level < 0)
        water_level = 0;

    ctx->stat_watl = water_level;

    switch (cfg->frame_type) {
    case INTRA_FRAME : {
        mpp_data_update_v2(ctx->i_bit, real_bit);
        ctx->i_sumbits = mpp_data_sum_v2(ctx->i_bit);
        ctx->i_scale = 80 * ctx->i_sumbits / (2 * ctx->p_sumbits);
        rc_dbg_rc("i_sumbits %d p_sumbits %d i_scale %d\n",
                  ctx->i_sumbits, ctx->p_sumbits, ctx->i_scale);
    } break;
    case INTER_P_FRAME : {
        mpp_data_update_v2(ctx->p_bit, real_bit);
        mpp_data_update_v2(ctx->madi,  madi);
        ctx->p_sumbits = mpp_data_sum_v2(ctx->p_bit);

        /* Avoid div zero when P frame successive drop */
        if (!ctx->p_sumbits)
            ctx->p_sumbits = 1;

        ctx->p_scale = 16;
    } break;
    case INTER_VI_FRAME: {
        mpp_data_update_v2(ctx->vi_bit, real_bit);
        ctx->vi_sumbits = mpp_data_sum_v2(ctx->vi_bit);
        ctx->vi_scale = 80 * ctx->vi_sumbits / (2 * ctx->p_sumbits);
        /* NOTE: vi_scale may be set to zero. So we should limit the range */
        ctx->vi_scale = mpp_clip(ctx->vi_scale, 16, 320);
    } break;
    case INTRA_RFH_FRAME: {
        mpp_data_update_v2(ctx->i_refresh_bit, real_bit);
        mpp_data_update_v2(ctx->madi,  madi);
        ctx->i_refresh_sumbits = mpp_data_sum_v2(ctx->i_refresh_bit);
        ctx->i_refresh_scale = 80 * ctx->i_refresh_sumbits / (usr_cfg->refresh_len * ctx->p_sumbits);
        ctx->i_refresh_scale = mpp_clip(ctx->i_refresh_scale, 16, 64);
    } break;
    default : {
    } break;
    }

    rc_dbg_func("leave %p\n", ctx);
    return MPP_OK;
}